

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  URLPatternType UVar1;
  char **ppcVar2;
  bool bVar3;
  int iVar4;
  char *__ptr;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  URLGlob *pUVar9;
  ulong uVar10;
  size_t __n;
  char numbuf [18];
  CURLcode local_6c;
  char *local_68;
  size_t local_60;
  char **local_58;
  URLGlob *local_50;
  char local_48 [24];
  
  *result = (char *)0x0;
  local_68 = filename;
  local_50 = glob;
  local_60 = strlen(filename);
  local_60 = local_60 + 1;
  __ptr = (char *)malloc(local_60);
  if (__ptr == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  __n = 0;
  uVar10 = 0;
  pcVar6 = (char *)0x0;
  local_58 = result;
  do {
    pcVar8 = local_68;
    if (*local_68 == '#') {
      iVar4 = Curl_isdigit((uint)(byte)local_68[1]);
      if (iVar4 == 0) goto LAB_0011aee2;
      uVar5 = strtoul(pcVar8 + 1,&local_68,10);
      uVar7 = local_50->size;
      if (uVar5 < uVar7) {
        pUVar9 = local_50;
        do {
          if (pUVar9->pattern[0].globindex == (int)uVar5 + -1) goto LAB_0011aea0;
          pUVar9 = (URLGlob *)(pUVar9->pattern + 1);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      pUVar9 = (URLGlob *)0x0;
LAB_0011aea0:
      if (pUVar9 == (URLGlob *)0x0) {
        bVar3 = true;
        __n = 1;
        local_68 = pcVar8 + 1;
      }
      else {
        UVar1 = pUVar9->pattern[0].type;
        if (UVar1 == UPTNumRange) {
          pcVar8 = local_48;
          curl_msnprintf(pcVar8,0x12,"%0*lu",pUVar9->pattern[0].content.NumRange.padlength,
                         pUVar9->pattern[0].content.NumRange.ptr_n);
          __n = strlen(pcVar8);
          bVar3 = true;
        }
        else if (UVar1 == UPTCharRange) {
          local_48[0] = pUVar9->pattern[0].content.CharRange.ptr_c;
          local_48[1] = 0;
          bVar3 = true;
          __n = 1;
          pcVar8 = local_48;
        }
        else {
          pcVar8 = pcVar6;
          if (UVar1 == UPTSet) {
            ppcVar2 = pUVar9->pattern[0].content.Set.elements;
            bVar3 = true;
            if (ppcVar2 != (char **)0x0) {
              pcVar8 = ppcVar2[pUVar9->pattern[0].content.Set.ptr_s];
              __n = strlen(pcVar8);
            }
          }
          else {
            bVar3 = false;
            curl_mfprintf(_stderr,"internal error: invalid pattern type (%d)\n");
            free(__ptr);
            local_6c = CURLE_FAILED_INIT;
            __ptr = (char *)0x0;
          }
        }
      }
      if (!bVar3) {
        return local_6c;
      }
    }
    else {
      if (*local_68 == '\0') {
        __ptr[uVar10] = '\0';
        *local_58 = __ptr;
        return CURLE_OK;
      }
LAB_0011aee2:
      local_68 = pcVar8 + 1;
      __n = 1;
    }
    uVar7 = __n + uVar10;
    if (local_60 <= uVar7) {
      pcVar6 = (char *)realloc(__ptr,uVar7 * 2 + 1);
      if (pcVar6 == (char *)0x0) {
        free(__ptr);
        return CURLE_OUT_OF_MEMORY;
      }
      local_60 = uVar7 * 2;
      __ptr = pcVar6;
    }
    memcpy(__ptr + uVar10,pcVar8,__n);
    uVar10 = uVar7;
    pcVar6 = pcVar8;
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, char *filename, URLGlob *glob)
{
  char *target;
  size_t allocsize;
  char numbuf[18];
  char *appendthis = NULL;
  size_t appendlen = 0;
  size_t stringlen = 0;

  *result = NULL;

  /* We cannot use the glob_buffer for storage here since the filename may
   * be longer than the URL we use. We allocate a good start size, then
   * we need to realloc in case of need.
   */
  allocsize = strlen(filename) + 1; /* make it at least one byte to store the
                                       trailing zero */
  target = malloc(allocsize);
  if(!target)
    return CURLE_OUT_OF_MEMORY;

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      URLPattern *pat = NULL;

      if(num < glob->size) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i<glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          snprintf(numbuf, sizeof(numbuf), "%0*lu",
                   pat->content.NumRange.padlength,
                   pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          Curl_safefree(target);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(appendlen + stringlen >= allocsize) {
      char *newstr;
      /* we append a single byte to allow for the trailing byte to be appended
         at the end of this function outside the while() loop */
      allocsize = (appendlen + stringlen) * 2;
      newstr = realloc(target, allocsize + 1);
      if(!newstr) {
        Curl_safefree(target);
        return CURLE_OUT_OF_MEMORY;
      }
      target = newstr;
    }
    memcpy(&target[stringlen], appendthis, appendlen);
    stringlen += appendlen;
  }
  target[stringlen]= '\0';

#if defined(MSDOS) || defined(WIN32)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, target,
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    Curl_safefree(target);
    if(sc)
      return CURLE_URL_MALFORMAT;
    target = sanitized;
  }
#endif /* MSDOS || WIN32 */

  *result = target;
  return CURLE_OK;
}